

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astDownCastNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t value;
  sysbvm_tuple_t result;
  undefined1 local_78 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_7a3dbbfd gcFrame;
  sysbvm_astDownCastNode_t **downCastNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x18);
  memset(local_78,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_78);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar2,
                  *(sysbvm_tuple_t *)(*arguments + 0x28));
  value = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar2,
                     *(sysbvm_tuple_t *)(*arguments + 0x30));
  result = sysbvm_functionBytecodeAssembler_newTemporary
                     (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),
                      *(sysbvm_tuple_t *)(*arguments + 0x20));
  _Var1 = sysbvm_tuple_boolean_decode(*(sysbvm_tuple_t *)(*arguments + 0x38));
  if (_Var1) {
    sysbvm_functionBytecodeAssembler_uncheckedDownCastValue
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),result,
               (sysbvm_tuple_t)gcFrameRecord.roots,value);
  }
  else {
    sysbvm_functionBytecodeAssembler_downCastValue
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar2 + 0x10),result,
               (sysbvm_tuple_t)gcFrameRecord.roots,value);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_78);
  return result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDownCastNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astDownCastNode_t **downCastNode = (sysbvm_astDownCastNode_t**)node;
    struct {
        sysbvm_tuple_t typeOperand;
        sysbvm_tuple_t valueOperand;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.typeOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*downCastNode)->typeExpression);
    gcFrame.valueOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*downCastNode)->valueExpression);
    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*downCastNode)->super.analyzedType);
    if(sysbvm_tuple_boolean_decode((*downCastNode)->isUnchecked))
        sysbvm_functionBytecodeAssembler_uncheckedDownCastValue(context, (*compiler)->assembler, gcFrame.result, gcFrame.typeOperand, gcFrame.valueOperand);
    else
        sysbvm_functionBytecodeAssembler_downCastValue(context, (*compiler)->assembler, gcFrame.result, gcFrame.typeOperand, gcFrame.valueOperand);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}